

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int compound_skip_using_neighbor_refs
              (MACROBLOCKD *xd,PREDICTION_MODE this_mode,MV_REFERENCE_FRAME *ref_frames,
              int prune_ext_comp_using_neighbors)

{
  int in_ECX;
  char in_SIL;
  long in_RDI;
  int track_ref_match;
  int is_ref_match [2];
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int local_4;
  
  if ((((in_SIL == '\x11') || (in_SIL == '\x12')) || (in_SIL == '\x18')) || (in_SIL == '\x17')) {
    local_4 = 0;
  }
  else if (in_ECX < 3) {
    memset(&stack0xffffffffffffffd4,0,8);
    if ((*(byte *)(in_RDI + 0x1ec1) & 1) != 0) {
      match_ref_frame((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(int *)0x2d68cc);
    }
    if ((*(byte *)(in_RDI + 0x1ec0) & 1) != 0) {
      match_ref_frame((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,(int *)0x2d68f5);
    }
    if (in_stack_ffffffffffffffd4 + local_28 < in_ECX) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int compound_skip_using_neighbor_refs(
    MACROBLOCKD *const xd, const PREDICTION_MODE this_mode,
    const MV_REFERENCE_FRAME *ref_frames, int prune_ext_comp_using_neighbors) {
  // Exclude non-extended compound modes from pruning
  if (this_mode == NEAREST_NEARESTMV || this_mode == NEAR_NEARMV ||
      this_mode == NEW_NEWMV || this_mode == GLOBAL_GLOBALMV)
    return 0;

  if (prune_ext_comp_using_neighbors >= 3) return 1;

  int is_ref_match[2] = { 0 };  // 0 - match for forward refs
                                // 1 - match for backward refs
  // Check if ref frames of this block matches with left neighbor.
  if (xd->left_available)
    match_ref_frame(xd->left_mbmi, ref_frames, is_ref_match);

  // Check if ref frames of this block matches with above neighbor.
  if (xd->up_available)
    match_ref_frame(xd->above_mbmi, ref_frames, is_ref_match);

  // Combine ref frame match with neighbors in forward and backward refs.
  const int track_ref_match = is_ref_match[0] + is_ref_match[1];

  // Pruning based on ref frame match with neighbors.
  if (track_ref_match >= prune_ext_comp_using_neighbors) return 0;
  return 1;
}